

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Diag.cpp
# Opt level: O3

char * Mond::GetSeverityName(Severity s)

{
  invalid_argument *this;
  
  if (s < (Error|Warning)) {
    return &DAT_0012563c + *(int *)(&DAT_0012563c + (ulong)s * 4);
  }
  this = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument(this,"unknown diagnostic severity");
  __cxa_throw(this,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

const char *Mond::GetSeverityName(Severity s)
{
	switch (s)
	{
	case Info:
		return "info";
	case Warning:
		return "warning";
	case Error:
		return "error";
	}

	throw invalid_argument("unknown diagnostic severity");
}